

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

void notifier(EventCount *eventCount)

{
  __int_type _Var1;
  long *plVar2;
  int iVar3;
  
  iVar3 = 0;
  do {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Notifying: ",0xb);
    plVar2 = (long *)std::ostream::operator<<((ostream *)&std::cout,iVar3);
    std::ios::widen((char)*(undefined8 *)(*plVar2 + -0x18) + (char)plVar2);
    std::ostream::put((char)plVar2);
    std::ostream::flush();
    LOCK();
    _Var1 = (eventCount->val_).super___atomic_base<unsigned_long>._M_i;
    (eventCount->val_).super___atomic_base<unsigned_long>._M_i =
         (eventCount->val_).super___atomic_base<unsigned_long>._M_i + 0x100000000;
    UNLOCK();
    if ((int)_Var1 != 0) {
      futexWakeImpl((Futex<std::atomic> *)
                    ((long)&(eventCount->val_).super___atomic_base<unsigned_long>._M_i + 4),1,
                    0xffffffff);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Notified: ",10);
    plVar2 = (long *)std::ostream::operator<<((ostream *)&std::cout,iVar3);
    std::ios::widen((char)*(undefined8 *)(*plVar2 + -0x18) + (char)plVar2);
    std::ostream::put((char)plVar2);
    std::ostream::flush();
    usleep(100);
    iVar3 = iVar3 + 1;
  } while (iVar3 != 100);
  return;
}

Assistant:

void notifier(EventCount *eventCount) {
    for (int i = 0; i < 100; i++) {
        std::cout << "Notifying: " << i << std::endl;
        eventCount->notify();
        std::cout << "Notified: " << i << std::endl;
        usleep(100);
    }
}